

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeHolder::detach(CodeHolder *this,BaseEmitter *emitter)

{
  long lVar1;
  Error EVar2;
  Error extraout_EAX;
  uint uVar3;
  uint uVar4;
  CodeHolder *pCVar5;
  ulong uVar6;
  CodeHolder *pCVar7;
  long lVar8;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar2 = 2;
  }
  else {
    if (emitter->_code == this) {
      if ((char)emitter->_emitterFlags < '\0') {
        EVar2 = 0;
        pCVar5 = (CodeHolder *)emitter;
        pCVar7 = this;
      }
      else {
        pCVar5 = this;
        pCVar7 = (CodeHolder *)emitter;
        EVar2 = (*emitter->_vptr_BaseEmitter[0x11])();
      }
      lVar1 = *(long *)&this->_emitters;
      uVar3 = *(uint *)&this->field_0xd0;
      uVar4 = 0xffffffff;
      if ((undefined1 *)(ulong)uVar3 != (undefined1 *)0x0) {
        pCVar5 = (CodeHolder *)0x0;
        do {
          if (*(BaseEmitter **)(lVar1 + (long)pCVar5 * 8) == emitter) {
            uVar4 = (uint)pCVar5;
            break;
          }
          pCVar5 = (CodeHolder *)&(pCVar5->_environment)._subArch;
        } while ((CodeHolder *)(ulong)uVar3 != pCVar5);
      }
      if (uVar4 == 0xffffffff) {
        detach();
      }
      else if (uVar4 < uVar3) {
        uVar3 = uVar3 - 1;
        *(uint *)&this->field_0xd0 = uVar3;
        if (uVar3 != uVar4) {
          uVar6 = (ulong)uVar4;
          memmove((void *)(lVar1 + uVar6 * 8),(void *)(lVar1 + uVar6 * 8 + 8),(uVar3 - uVar6) * 8);
        }
        emitter->_code = (CodeHolder *)0x0;
        return EVar2;
      }
      detach();
      pCVar7->_logger = (Logger *)pCVar5;
      uVar3 = *(uint *)&pCVar7->field_0xd0;
      EVar2 = extraout_EAX;
      if ((ulong)uVar3 != 0) {
        lVar1 = *(long *)&pCVar7->_emitters;
        lVar8 = 0;
        do {
          EVar2 = (**(code **)(**(long **)(lVar1 + lVar8) + 0x90))();
          lVar8 = lVar8 + 8;
        } while ((ulong)uVar3 << 3 != lVar8);
      }
      return EVar2;
    }
    EVar2 = 3;
  }
  return EVar2;
}

Assistant:

Error CodeHolder::detach(BaseEmitter* emitter) noexcept {
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(emitter->_code != this))
    return DebugUtils::errored(kErrorInvalidState);

  // NOTE: We always detach if we were asked to, if error happens during
  // `emitter->onDetach()` we just propagate it, but the BaseEmitter will
  // be detached.
  Error err = kErrorOk;
  if (!emitter->isDestroyed())
    err = emitter->onDetach(this);

  // Disconnect CodeHolder <-> BaseEmitter.
  uint32_t index = _emitters.indexOf(emitter);
  ASMJIT_ASSERT(index != Globals::kNotFound);

  _emitters.removeAt(index);
  emitter->_code = nullptr;

  return err;
}